

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpContext.cpp
# Opt level: O2

void __thiscall glslang::TPpContext::~TPpContext(TPpContext *this)

{
  this->_vptr_TPpContext = (_func_int **)&PTR__TPpContext_0089b318;
  if (this->preamble != (char *)0x0) {
    operator_delete__(this->preamble);
  }
  while ((this->inputStack).
         super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (this->inputStack).
         super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
    popInput(this);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&this->strtodStream);
  std::__cxx11::string::_M_dispose();
  std::
  _Deque_base<glslang::TShader::Includer::IncludeResult_*,_std::allocator<glslang::TShader::Includer::IncludeResult_*>_>
  ::~_Deque_base((_Deque_base<glslang::TShader::Includer::IncludeResult_*,_std::allocator<glslang::TShader::Includer::IncludeResult_*>_>
                  *)&this->includeStack);
  std::__cxx11::string::_M_dispose();
  std::_Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>::
  ~_Vector_base(&(this->inputStack).
                 super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
               );
  std::_Vector_base<glslang::TSourceLoc,_std::allocator<glslang::TSourceLoc>_>::~_Vector_base
            (&(this->lastLineTokenLocs).
              super__Vector_base<glslang::TSourceLoc,_std::allocator<glslang::TSourceLoc>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->lastLineTokens).super__Vector_base<int,_std::allocator<int>_>);
  memset((this->atomStrings).atomMap.
         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
         ._M_h._M_buckets,0,
         (this->atomStrings).atomMap.
         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
         ._M_h._M_bucket_count << 3);
  (this->atomStrings).atomMap.
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->atomStrings).atomMap.
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
  ._M_h._M_element_count = 0;
  std::
  _Rb_tree<int,_std::pair<const_int,_glslang::TPpContext::MacroSymbol>,_std::_Select1st<std::pair<const_int,_glslang::TPpContext::MacroSymbol>_>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TPpContext::MacroSymbol>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_glslang::TPpContext::MacroSymbol>,_std::_Select1st<std::pair<const_int,_glslang::TPpContext::MacroSymbol>_>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TPpContext::MacroSymbol>_>_>
               *)&this->macroDefs);
  return;
}

Assistant:

TPpContext::~TPpContext()
{
    delete [] preamble;

    // free up the inputStack
    while (! inputStack.empty())
        popInput();
}